

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall S2BooleanOperation::Impl::AreRegionsIdentical(Impl *this)

{
  double dVar1;
  double dVar2;
  S2ShapeIndex *pSVar3;
  S2ShapeIndex *pSVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  ReferencePoint a_ref;
  ReferencePoint b_ref;
  S2LogMessage local_90;
  char local_78 [24];
  double local_60 [3];
  char local_48 [24];
  long *plVar9;
  undefined4 extraout_var_00;
  
  pSVar3 = this->op_->regions_[0];
  pSVar4 = this->op_->regions_[1];
  bVar16 = true;
  if (pSVar3 != pSVar4) {
    uVar5 = (*pSVar3->_vptr_S2ShapeIndex[2])(pSVar3);
    uVar6 = (*pSVar4->_vptr_S2ShapeIndex[2])(pSVar4);
    if (uVar5 == uVar6) {
      if (0 < (int)uVar5) {
        uVar13 = 0;
        do {
          iVar7 = (*pSVar3->_vptr_S2ShapeIndex[3])(pSVar3,uVar13);
          plVar9 = (long *)CONCAT44(extraout_var,iVar7);
          iVar7 = (*pSVar4->_vptr_S2ShapeIndex[3])(pSVar4,uVar13);
          plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
          iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9);
          iVar8 = (**(code **)(*plVar10 + 0x20))(plVar10);
          if (iVar7 != iVar8) goto LAB_0019f4ef;
          iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9);
          if (iVar7 == 2) {
            (**(code **)(*plVar9 + 0x28))(&local_90,plVar9);
            (**(code **)(*plVar10 + 0x28))(local_60,plVar10);
            lVar11 = 0;
            do {
              dVar1 = *(double *)((long)&local_90.severity_ + lVar11);
              dVar2 = *(double *)((long)local_60 + lVar11);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar16 = lVar11 != 0x10;
              lVar11 = lVar11 + 8;
            } while (bVar16);
            if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) || (local_78[0] != local_48[0]))
            goto LAB_0019f4ef;
          }
          iVar7 = (**(code **)(*plVar9 + 0x30))(plVar9);
          iVar8 = (**(code **)(*plVar10 + 0x30))(plVar10);
          if (iVar7 != iVar8) goto LAB_0019f4ef;
          if (0 < iVar7) {
            iVar8 = 0;
            do {
              lVar11 = (**(code **)(*plVar9 + 0x38))(plVar9,iVar8);
              uVar12 = (**(code **)(*plVar10 + 0x38))(plVar10,iVar8);
              if ((int)lVar11 != (int)uVar12) {
                S2LogMessage::S2LogMessage
                          (&local_90,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x8a8,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_90.stream_,"Check failed: (a_chain.start) == (b_chain.start) ",0x31
                          );
                abort();
              }
              iVar14 = (int)((ulong)lVar11 >> 0x20);
              if (iVar14 != (int)((ulong)uVar12 >> 0x20)) goto LAB_0019f4ef;
              if (iVar14 != 0 && -1 < lVar11) {
                iVar15 = 0;
                do {
                  (**(code **)(*plVar9 + 0x40))(&local_90,plVar9,iVar8,iVar15);
                  (**(code **)(*plVar10 + 0x40))(local_60,plVar10,iVar8,iVar15);
                  lVar11 = 0;
                  do {
                    dVar1 = *(double *)((long)&local_90.severity_ + lVar11);
                    dVar2 = *(double *)((long)local_60 + lVar11);
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                    bVar16 = lVar11 != 0x10;
                    lVar11 = lVar11 + 8;
                  } while (bVar16);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019f4ef;
                  lVar11 = 0x18;
                  do {
                    dVar1 = *(double *)((long)&local_90.severity_ + lVar11);
                    dVar2 = *(double *)((long)local_60 + lVar11);
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                    bVar16 = lVar11 != 0x28;
                    lVar11 = lVar11 + 8;
                  } while (bVar16);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019f4ef;
                  iVar15 = iVar15 + 1;
                } while (iVar15 != iVar14);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != iVar7);
          }
          uVar6 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar6;
        } while (uVar6 != uVar5);
        bVar16 = true;
      }
    }
    else {
LAB_0019f4ef:
      bVar16 = false;
    }
  }
  return bVar16;
}

Assistant:

bool S2BooleanOperation::Impl::AreRegionsIdentical() const {
  const S2ShapeIndex* a = op_->regions_[0];
  const S2ShapeIndex* b = op_->regions_[1];
  if (a == b) return true;
  int num_shape_ids = a->num_shape_ids();
  if (num_shape_ids != b->num_shape_ids()) return false;
  for (int s = 0; s < num_shape_ids; ++s) {
    const S2Shape* a_shape = a->shape(s);
    const S2Shape* b_shape = b->shape(s);
    if (a_shape->dimension() != b_shape->dimension()) return false;
    if (a_shape->dimension() == 2) {
      auto a_ref = a_shape->GetReferencePoint();
      auto b_ref = b_shape->GetReferencePoint();
      if (a_ref.point != b_ref.point) return false;
      if (a_ref.contained != b_ref.contained) return false;
    }
    int num_chains = a_shape->num_chains();
    if (num_chains != b_shape->num_chains()) return false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain a_chain = a_shape->chain(c);
      S2Shape::Chain b_chain = b_shape->chain(c);
      S2_DCHECK_EQ(a_chain.start, b_chain.start);
      if (a_chain.length != b_chain.length) return false;
      for (int i = 0; i < a_chain.length; ++i) {
        S2Shape::Edge a_edge = a_shape->chain_edge(c, i);
        S2Shape::Edge b_edge = b_shape->chain_edge(c, i);
        if (a_edge.v0 != b_edge.v0) return false;
        if (a_edge.v1 != b_edge.v1) return false;
      }
    }
  }
  return true;
}